

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

Bool prvTidyEntityInfo(ctmbstr name,Bool isXml,uint *code,uint *versions)

{
  char cVar1;
  ctmbstr *pptVar2;
  uint in_EAX;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  entity *peVar7;
  ctmbstr ptVar8;
  bool bVar9;
  ulong uStack_38;
  uint c;
  
  if ((name == (ctmbstr)0x0) || (*name != '&')) {
    __assert_fail("name && name[0] == \'&\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/entities.c"
                  ,0x846,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (code == (uint *)0x0) {
    __assert_fail("code != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/entities.c"
                  ,0x847,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (versions == (uint *)0x0) {
    __assert_fail("versions != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/entities.c"
                  ,0x848,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  cVar1 = name[1];
  if (cVar1 != '\0') {
    if (cVar1 == '#') {
      uStack_38 = (ulong)in_EAX;
      if ((name[2] == 'x') || (name[2] == 'X' && isXml == no)) {
        ptVar8 = name + 3;
        pcVar6 = "%x";
      }
      else {
        ptVar8 = name + 2;
        pcVar6 = "%u";
      }
      iVar3 = __isoc99_sscanf(ptVar8,pcVar6,&c);
      bVar9 = iVar3 == 1;
      uVar5 = 0;
      if (bVar9) {
        uVar5 = c;
      }
      uVar4 = 0x61fff;
      if (!bVar9) {
        uVar4 = (uint)(isXml != no) * 0x2000 + 0xe000;
      }
      *code = uVar5;
      *versions = uVar4;
      return (uint)bVar9;
    }
    peVar7 = entities;
    do {
      peVar7 = peVar7 + 1;
      pcVar6 = peVar7[-1].name;
      if (pcVar6 == (char *)0x0) break;
    } while (cVar1 != *pcVar6);
    while ((pcVar6 != (ctmbstr)0x0 && (cVar1 == *pcVar6))) {
      iVar3 = prvTidytmbstrcmp(name + 1,pcVar6);
      if (iVar3 == 0) {
        uVar5 = peVar7[-1].versions;
        *code = peVar7[-1].code;
        *versions = uVar5;
        return yes;
      }
      pptVar2 = &peVar7->name;
      peVar7 = peVar7 + 1;
      pcVar6 = *pptVar2;
    }
  }
  *code = 0;
  *versions = (uint)(isXml != no) * 0x2000 + 0xe000;
  return no;
}

Assistant:

Bool TY_(EntityInfo)( ctmbstr name, Bool isXml, uint* code, uint* versions )
{
    const entity* np;
    int res;
    assert( name && name[0] == '&' );
    assert( code != NULL );
    assert( versions != NULL );

    /* numeric entitity: name = "&#" followed by number */
    if ( name[1] == '#' )
    {
        uint c = 0;  /* zero on missing/bad number */

        /* 'x' prefix denotes hexadecimal number format */
        if ( name[2] == 'x' || (!isXml && name[2] == 'X') )
            res = sscanf( name+3, "%x", &c );
        else
            res = sscanf( name+2, "%u", &c );

        /*  Issue #373 - Null Char in XML result doc - sf905 2009 */
        if ( res == 1 )
        {
            *code = c;
            *versions = VERS_ALL;
            return yes;
        }
        else
        {
            *code = 0;
            *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
            return no;
        }
    }

    /* Named entity: name ="&" followed by a name */
    if ( NULL != (np = entitiesLookup(name+1)) )
    {
        *code = np->code;
        *versions = np->versions;
        return yes;
    }

    *code = 0;
    *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
    return no;
}